

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

string * __thiscall
QPDFJob::doUnderOverlayForPage_abi_cxx11_
          (string *__return_storage_ptr__,QPDFJob *this,QPDF *pdf,UnderOverlay *uo,
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          *pagenos,size_t page_idx,size_t uo_idx,
          map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
          *fo,vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *pages,
          QPDFPageObjectHelper *dest_page)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pQVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  Rectangle rect;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  mapped_type *pmVar8;
  _Rb_tree_header *p_Var9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  QPDFAcroFormDocumentHelper *from_afdh;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  ulong uVar15;
  pointer piVar16;
  int from_pageno;
  int min_suffix;
  int pageno;
  value_type from_page;
  QPDFObjectHandle resources;
  QPDFMatrix cm;
  QPDFObjectHandle xobject;
  string new_content;
  string name;
  anon_class_8_1_89895067 make_afdh;
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  afdh;
  int local_23c;
  int local_238;
  int local_234;
  QPDFPageObjectHelper local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  string *local_1f0;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  QPDFObjectHandle local_178;
  string local_168;
  string local_148;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  QPDFObjectHandle *local_108;
  pointer local_100;
  QPDFAcroFormDocumentHelper *local_f8;
  UnderOverlay *local_f0;
  QPDFJob *local_e8;
  anon_class_8_1_89895067 local_e0;
  QPDFObjectHandle local_d8;
  undefined1 local_c8 [24];
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  element_type *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  Rectangle local_80;
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  local_60;
  
  if (page_idx >> 0x1f != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(page_idx);
  }
  iVar4 = (int)page_idx;
  local_234 = iVar4 + 1;
  p_Var13 = (pagenos->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var13 != (_Base_ptr)0x0) {
    p_Var9 = &(pagenos->_M_t)._M_impl.super__Rb_tree_header;
    p_Var14 = &p_Var9->_M_header;
    do {
      if (iVar4 < (int)p_Var13[1]._M_color) {
        p_Var14 = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color <= iVar4];
    } while (p_Var13 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var14 != p_Var9) && ((int)p_Var14[1]._M_color <= local_234)) {
      pmVar8 = std::
               map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
               ::operator[](pagenos,&local_234);
      p_Var13 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var13 != (_Base_ptr)0x0) {
        p_Var9 = &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
        p_Var14 = &p_Var9->_M_header;
        do {
          if (*(ulong *)(p_Var13 + 1) >= uo_idx) {
            p_Var14 = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uo_idx];
        } while (p_Var13 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var14 != p_Var9) && (*(ulong *)(p_Var14 + 1) <= uo_idx)) {
          local_60._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_60._M_impl.super__Rb_tree_header._M_header;
          local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_e0.afdh =
               (map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                *)&local_60;
          local_e8 = this;
          local_60._M_impl.super__Rb_tree_header._M_header._M_right =
               local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          local_f8 = doUnderOverlayForPage::anon_class_8_1_89895067::operator()
                               (&local_e0,
                                (QPDFPageObjectHelper *)
                                (dest_page->super_QPDFObjectHelper).super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          local_1f8 = &__return_storage_ptr__->field_2;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f8;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          local_238 = 1;
          p_Var2 = &local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          local_230.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var2;
          local_1f0 = __return_storage_ptr__;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/Resources","");
          QPDFPageObjectHelper::getAttribute
                    ((QPDFPageObjectHelper *)local_1c8,(string *)dest_page,SUB81(&local_230,0));
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_230.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var2) {
            operator_delete(local_230.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (ulong)((long)&(local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
          local_108 = (QPDFObjectHandle *)pdf;
          local_f0 = uo;
          pmVar8 = std::
                   map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                   ::operator[](pagenos,&local_234);
          pmVar10 = std::
                    map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](pmVar8,&uo_idx);
          piVar16 = (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_100 = (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          if (piVar16 != local_100) {
            do {
              local_23c = *piVar16;
              local_128._M_unused._M_object = local_f0;
              local_110 = std::
                          _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:1928:21)>
                          ::_M_invoke;
              local_118 = std::
                          _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:1928:21)>
                          ::_M_manager;
              local_128._8_8_ = &local_23c;
              doIfVerbose(local_e8,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_128);
              if (local_118 != (code *)0x0) {
                (*local_118)(&local_128,&local_128,__destroy_functor);
              }
              uVar1 = (long)local_23c - 1;
              if ((long)local_23c < 1) {
                QIntC::IntConverter<int,_unsigned_long,_true,_false>::error((int)uVar1);
              }
              __return_storage_ptr__ = local_1f0;
              pQVar3 = (pages->
                       super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar15 = ((long)(pages->
                              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar3 >> 3) *
                       0x6db6db6db6db6db7;
              if (uVar15 < uVar1 || uVar15 - uVar1 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar1);
              }
              local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   pQVar3[uVar1].super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&pQVar3[uVar1].super_QPDFObjectHelper.super_BaseHandle.obj + 8))->_M_pi;
              if (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   pQVar3[uVar1].super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&pQVar3[uVar1].super_QPDFObjectHelper.oh_.super_BaseHandle + 8))->_M_pi;
              if (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_230.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                   (_func_int **)&PTR__QPDFPageObjectHelper_002eb088;
              local_230.m.
              super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   pQVar3[uVar1].m.
                   super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_230.m.
              super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   pQVar3[uVar1].m.
                   super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_230.m.
                  super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_230.m.
                   super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_230.m.
                        super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_230.m.
                   super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_230.m.
                        super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              pmVar11 = std::
                        map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                        ::operator[](fo,&local_23c);
              p_Var13 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              if (p_Var13 == (_Base_ptr)0x0) {
LAB_001828fd:
                QPDFPageObjectHelper::getFormXObjectForPage
                          ((QPDFPageObjectHelper *)local_c8,SUB81(&local_230,0));
                QPDF::copyForeignObject((QPDF *)local_1b8,local_108);
                pmVar11 = std::
                          map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                          ::operator[](fo,&local_23c);
                pmVar12 = std::
                          map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                          ::operator[](pmVar11,&uo_idx);
                uVar6 = local_1b8._8_8_;
                uVar5 = local_1b8._0_8_;
                local_1b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_1b8._8_8_ = (element_type *)0x0;
                this_00 = (pmVar12->super_BaseHandle).obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
                (pmVar12->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)uVar5;
                (pmVar12->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
                if ((element_type *)local_1b8._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
                }
                if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
                }
              }
              else {
                p_Var9 = &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
                p_Var14 = &p_Var9->_M_header;
                do {
                  if (*(ulong *)(p_Var13 + 1) >= uo_idx) {
                    p_Var14 = p_Var13;
                  }
                  p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uo_idx];
                } while (p_Var13 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var14 == p_Var9) || (uo_idx < *(ulong *)(p_Var14 + 1)))
                goto LAB_001828fd;
              }
              local_1b8._0_8_ = local_1b8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/Fx","");
              QPDFObjectHandle::getUniqueResourceName
                        (&local_148,(QPDFObjectHandle *)local_1c8,(string *)local_1b8,&local_238,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x0);
              if ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10)) {
                operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
              }
              QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1b8);
              pmVar11 = std::
                        map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                        ::operator[](fo,&local_23c);
              pmVar12 = std::
                        map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                        ::operator[](pmVar11,&uo_idx);
              local_178.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pmVar12->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_178.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (pmVar12->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if (local_178.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_178.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_178.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_178.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_178.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              QPDFPageObjectHelper::getTrimBox
                        ((QPDFPageObjectHelper *)local_1e8,SUB81(dest_page,0),false);
              QPDFObjectHandle::getArrayAsRectangle(&local_80,(QPDFObjectHandle *)local_1e8);
              rect.lly = local_80.lly;
              rect.llx = local_80.llx;
              rect.urx = local_80.urx;
              rect.ury = local_80.ury;
              QPDFPageObjectHelper::placeFormXObject
                        (&local_168,dest_page,&local_178,&local_148,rect,(QPDFMatrix *)local_1b8,
                         true,true,false);
              if ((element_type *)local_1e8._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
              }
              if (local_178.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_178.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              local_b0 = local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a8._M_pi =
                   local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_a0 = local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_98._M_pi =
                   local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_230.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_c8._16_8_ = &PTR__QPDFPageObjectHelper_002eb088;
              local_90 = local_230.m.
                         super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
              local_88 = local_230.m.
                         super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
              if (local_230.m.
                  super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_230.m.
                   super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_230.m.
                        super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_230.m.
                   super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_230.m.
                        super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              from_afdh = doUnderOverlayForPage::anon_class_8_1_89895067::operator()
                                    (&local_e0,
                                     (QPDFPageObjectHelper *)
                                     local_230.super_QPDFObjectHelper.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
              QPDFPageObjectHelper::copyAnnotations
                        (dest_page,(QPDFPageObjectHelper *)(local_c8 + 0x10),(QPDFMatrix *)local_1b8
                         ,local_f8,from_afdh);
              QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)(local_c8 + 0x10))
              ;
              if (local_168._M_string_length != 0) {
                operator____qpdf((char *)&local_d8,0x267213);
                QPDFObjectHandle::mergeResources
                          ((QPDFObjectHandle *)local_1c8,&local_d8,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            *)0x0);
                if (local_d8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_d8.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                local_1e8._0_8_ = local_1e8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"/XObject","");
                QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_1a8 + 0x20),(string *)local_1c8)
                ;
                if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                  operator_delete((void *)local_1e8._0_8_,
                                  (ulong)((long)(_func_int ***)local_1e8._16_8_ + 1));
                }
                bVar7 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_1a8 + 0x20));
                if (bVar7) {
                  pmVar11 = std::
                            map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                            ::operator[](fo,&local_23c);
                  pmVar12 = std::
                            map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                            ::operator[](pmVar11,&uo_idx);
                  QPDFObjectHandle::replaceKey
                            ((QPDFObjectHandle *)(local_1a8 + 0x20),&local_148,pmVar12);
                }
                local_238 = local_238 + 1;
                std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_168._M_dataplus._M_p);
                if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_230);
              piVar16 = piVar16 + 1;
            } while (piVar16 != local_100);
          }
          if ((element_type *)local_1c8._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
          }
          std::
          _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
          ::~_Rb_tree(&local_60);
          return __return_storage_ptr__;
        }
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::doUnderOverlayForPage(
    QPDF& pdf,
    UnderOverlay& uo,
    std::map<int, std::map<size_t, std::vector<int>>>& pagenos,
    size_t page_idx,
    size_t uo_idx,
    std::map<int, std::map<size_t, QPDFObjectHandle>>& fo,
    std::vector<QPDFPageObjectHelper>& pages,
    QPDFPageObjectHelper& dest_page)
{
    int pageno = 1 + QIntC::to_int(page_idx);
    if (!(pagenos.count(pageno) && pagenos[pageno].count(uo_idx))) {
        return "";
    }

    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>> afdh;
    auto make_afdh = [&](QPDFPageObjectHelper& ph) {
        QPDF& q = ph.getObjectHandle().getQPDF();
        return get_afdh_for_qpdf(afdh, &q);
    };
    auto dest_afdh = make_afdh(dest_page);

    std::string content;
    int min_suffix = 1;
    QPDFObjectHandle resources = dest_page.getAttribute("/Resources", true);
    for (int from_pageno: pagenos[pageno][uo_idx]) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << "    " << uo.filename << " " << uo.which << " " << from_pageno << "\n";
        });
        auto from_page = pages.at(QIntC::to_size(from_pageno - 1));
        if (fo[from_pageno].count(uo_idx) == 0) {
            fo[from_pageno][uo_idx] = pdf.copyForeignObject(from_page.getFormXObjectForPage());
        }

        // If the same page is overlaid or underlaid multiple times, we'll generate multiple names
        // for it, but that's harmless and also a pretty goofy case that's not worth coding around.
        std::string name = resources.getUniqueResourceName("/Fx", min_suffix);
        QPDFMatrix cm;
        std::string new_content = dest_page.placeFormXObject(
            fo[from_pageno][uo_idx], name, dest_page.getTrimBox().getArrayAsRectangle(), cm);
        dest_page.copyAnnotations(from_page, cm, dest_afdh, make_afdh(from_page));
        if (!new_content.empty()) {
            resources.mergeResources("<< /XObject << >> >>"_qpdf);
            auto xobject = resources.getKey("/XObject");
            if (xobject.isDictionary()) {
                xobject.replaceKey(name, fo[from_pageno][uo_idx]);
            }
            ++min_suffix;
            content += new_content;
        }
    }
    return content;
}